

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,return_statement *s)

{
  expression *peVar1;
  return_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"return");
  peVar1 = return_statement::e(s);
  if (peVar1 != (expression *)0x0) {
    std::operator<<(this->os_," ");
    peVar1 = return_statement::e(s);
    accept<mjs::print_visitor>(peVar1,this);
  }
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const return_statement& s) {
        os_ << "return";
        if (s.e()) {
            os_ << " ";
            accept(*s.e(), *this);
        }
        os_ << ';';
    }